

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

qsizetype findLocaleIndexById(QLocaleId localeId)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  QLocaleData *pQVar4;
  ushort uVar5;
  
  uVar5 = localeId.language_id;
  if (uVar5 == 0 || locale_index[uVar5] != 0) {
    uVar3 = (ulong)locale_index[uVar5];
    pQVar4 = locale_data + uVar3 + 1;
    while (((uVar1._0_2_ = pQVar4[-1].m_script_id, uVar1._2_2_ = pQVar4[-1].m_territory_id,
            ((uint6)localeId & 0xffff00000000) != 0 &&
            (uVar1 >> 0x10 != (uint)localeId.territory_id)) ||
           ((localeId.script_id != 0 && (((uVar1 ^ localeId._2_4_) & 0xffff) != 0))))) {
      uVar3 = uVar3 + 1;
      bVar2 = pQVar4->m_language_id != 0;
      if (uVar5 != 0) {
        bVar2 = pQVar4->m_language_id == uVar5;
      }
      pQVar4 = pQVar4 + 1;
      if (!bVar2) {
        return -1;
      }
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static qsizetype findLocaleIndexById(QLocaleId localeId) noexcept
{
    qsizetype idx = locale_index[localeId.language_id];
    // If there are no locales for specified language (so we we've got the
    // default language, which has no associated script or country), give up:
    if (localeId.language_id && idx == 0)
        return idx;

    Q_ASSERT(localeId.acceptLanguage(locale_data[idx].m_language_id));

    do {
        if (localeId.acceptScriptTerritory(locale_data[idx].id()))
            return idx;
        ++idx;
    } while (localeId.acceptLanguage(locale_data[idx].m_language_id));

    return -1;
}